

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

void __thiscall
DReachabilityPropagator::explain_dominator(DReachabilityPropagator *this,int u,int dom,Clause **r)

{
  undefined1 uVar1;
  bool bVar2;
  Lit LVar3;
  int iVar4;
  int iVar5;
  BoolView *pBVar6;
  vector<bool,_std::allocator<bool>_> *this_00;
  allocator_type *__a;
  vec<Lit> *pvVar7;
  undefined8 *in_RCX;
  DReachabilityPropagator *in_RDI;
  vector<bool,_std::allocator<bool>_> v;
  vector<bool,_std::allocator<bool>_> red;
  vec<Lit> ps;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  GraphPropagator *in_stack_fffffffffffffee0;
  allocator_type *in_stack_fffffffffffffee8;
  vec<Lit> *in_stack_fffffffffffffef0;
  bool *__value;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined8 in_stack_ffffffffffffff28;
  int skip_n;
  undefined7 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  int skip_n_00;
  undefined7 in_stack_ffffffffffffff60;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff68;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  DReachabilityPropagator *in_stack_ffffffffffffff80;
  vec<Lit> local_28;
  undefined8 *local_18;
  
  skip_n = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  pvVar7 = &local_28;
  local_18 = in_RCX;
  vec<Lit>::vec(pvVar7);
  skip_n_00 = (int)((ulong)pvVar7 >> 0x20);
  vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffee0);
  get_root_idx(in_RDI);
  GraphPropagator::getNodeVar(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  LVar3 = BoolView::getValLit((BoolView *)
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  vec<Lit>::push(in_stack_fffffffffffffef0,(Lit *)in_stack_fffffffffffffee8);
  pBVar6 = GraphPropagator::getNodeVar(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  iVar5 = (int)((ulong)pBVar6 >> 0x20);
  uVar1 = BoolView::isFixed((BoolView *)0x2b0d17);
  if ((bool)uVar1) {
    pBVar6 = GraphPropagator::getNodeVar(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    skip_n = (int)((ulong)pBVar6 >> 0x20);
    bVar2 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffee0);
    if (bVar2) {
      GraphPropagator::getNodeVar(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      BoolView::getValLit((BoolView *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
      ;
      vec<Lit>::push(in_stack_fffffffffffffef0,(Lit *)in_stack_fffffffffffffee8);
    }
  }
  iVar4 = GraphPropagator::nbNodes((GraphPropagator *)0x2b0dcb);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(long)iVar4;
  std::allocator<bool>::allocator((allocator<bool> *)0x2b0df6);
  std::vector<bool,_std::allocator<bool>_>::vector
            (this_00,CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (bool *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::allocator<bool>::~allocator((allocator<bool> *)0x2b0e24);
  reverseDFS((DReachabilityPropagator *)CONCAT44(LVar3.x,in_stack_ffffffffffffff40),iVar5,
             (vector<bool,_std::allocator<bool>_> *)CONCAT17(uVar1,in_stack_ffffffffffffff30),skip_n
            );
  iVar5 = GraphPropagator::nbNodes((GraphPropagator *)0x2b0e50);
  __a = (allocator_type *)(long)iVar5;
  uVar1 = 0;
  __value = (bool *)&stack0xffffffffffffff66;
  std::allocator<bool>::allocator((allocator<bool> *)0x2b0e7b);
  std::vector<bool,_std::allocator<bool>_>::vector
            (this_00,CONCAT44(iVar5,in_stack_fffffffffffffef8),__value,__a);
  std::allocator<bool>::~allocator((allocator<bool> *)0x2b0ea9);
  reverseDFStoBorder(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                     in_stack_ffffffffffffff68,(vec<Lit> *)CONCAT17(uVar1,in_stack_ffffffffffffff60)
                     ,skip_n_00);
  pvVar7 = (vec<Lit> *)Reason_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffee0);
  *local_18 = pvVar7;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x2b0f0d)
  ;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x2b0f1a)
  ;
  vec<Lit>::~vec(pvVar7);
  return;
}

Assistant:

void DReachabilityPropagator::explain_dominator(int u, int dom, Clause** r) {
	if (DEBUG) {
		std::cout << "Explain dominators " << getNodeVar(get_root_idx()).isFixed()
							<< getNodeVar(u).isFixed() << '\n';
	}
	vec<Lit> ps;
	ps.push();
	ps.push(getNodeVar(get_root_idx()).getValLit());
	if (getNodeVar(u).isFixed() && getNodeVar(u).isTrue()) {
		ps.push(getNodeVar(u).getValLit());
	}
	std::vector<bool> red(nbNodes(), false);
	reverseDFS(u, red, dom);
	std::vector<bool> v(nbNodes(), false);
	reverseDFStoBorder(u, v, red, ps, dom);
	if (DEBUG) {
		std::cout << "Size expl for dominator " << ps.size() << '\n';
	}
	*r = Reason_new(ps);
}